

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall Server::Server(Server *this,int listen_port)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  long *plVar5;
  runtime_error *prVar6;
  long *plVar7;
  int opt;
  sockaddr_in listenaddr;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [20];
  undefined4 local_44;
  sockaddr_in local_40;
  
  (this->waitingForResolve).
  super__List_base<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->waitingForResolve;
  (this->waitingForResolve).
  super__List_base<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->waitingForResolve;
  (this->waitingForResolve).
  super__List_base<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->waitingForHandshake).
  super__List_base<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->waitingForHandshake;
  (this->waitingForHandshake).
  super__List_base<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->waitingForHandshake;
  (this->waitingForHandshake).
  super__List_base<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->connections).super__List_base<Connection_*,_std::allocator<Connection_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->connections;
  (this->connections).super__List_base<Connection_*,_std::allocator<Connection_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->connections;
  (this->connections).super__List_base<Connection_*,_std::allocator<Connection_*>_>._M_impl._M_node.
  _M_size = 0;
  iVar1 = socket(2,1,0);
  this->listen_sockfd = iVar1;
  this->maxfd = 0;
  signal(0xd,(__sighandler_t)0x1);
  iVar1 = this->listen_sockfd;
  iVar2 = this->maxfd;
  if (this->maxfd <= iVar1) {
    iVar2 = iVar1;
  }
  this->maxfd = iVar2;
  if (0x3ff < iVar1) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Socket number out of range for select","");
    std::runtime_error::runtime_error(prVar6,(string *)&local_88);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_44 = 1;
  setsockopt(iVar1,1,2,&local_44,4);
  local_40 = Utils::get_sockaddr((char *)0x0,listen_port);
  iVar1 = bind(this->listen_sockfd,(sockaddr *)&local_40,0x10);
  if (iVar1 != 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"bind: ","");
    piVar4 = __errno_location();
    strerror(*piVar4);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_68);
    local_88 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_88 == plVar7) {
      local_78 = *plVar7;
      lStack_70 = plVar5[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar7;
    }
    local_80 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_88);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  signal(0xd,(__sighandler_t)0x1);
  iVar1 = listen(this->listen_sockfd,0x1000);
  if (iVar1 == 0) {
    iVar1 = this->listen_sockfd;
    uVar3 = fcntl(iVar1,3,0);
    iVar1 = fcntl(iVar1,4,(ulong)(uVar3 | 0x800));
    if (iVar1 != -1) {
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Can\'t make server socket nonblock!");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"listen: ","");
  piVar4 = __errno_location();
  strerror(*piVar4);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_68);
  local_88 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_88 == plVar7) {
    local_78 = *plVar7;
    lStack_70 = plVar5[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar7;
  }
  local_80 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(prVar6,(string *)&local_88);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Server::Server(int listen_port) :
        listen_sockfd(socket(AF_INET, SOCK_STREAM, 0)),
        maxfd(0) {

    signal(SIGPIPE, SIG_IGN);
    if (!add_fd(listen_sockfd)) {
        throw std::runtime_error(std::string("Socket number out of range for select"));
    }
    int opt = 1;
    setsockopt(listen_sockfd, SOL_SOCKET, SO_REUSEADDR, &opt, sizeof(opt));
    struct sockaddr_in listenaddr = Utils::get_sockaddr(NULL, listen_port);


    if (bind(listen_sockfd, reinterpret_cast<struct sockaddr *>(&listenaddr), sizeof(listenaddr))) {
        throw std::runtime_error(std::string("bind: ") + strerror(errno));
    }

    signal(SIGPIPE, SIG_IGN);

    if (listen(listen_sockfd, SOMAXCONN)) {
        throw std::runtime_error(std::string("listen: ") + strerror(errno));
    }
    if (fcntl(listen_sockfd, F_SETFL, fcntl(listen_sockfd, F_GETFL, 0) | O_NONBLOCK) == -1) {
        throw std::runtime_error("Can't make server socket nonblock!");
    }
}